

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_test.cc
# Opt level: O2

void re2::MultithreadedSearchDFA(void)

{
  int iVar1;
  Regexp *this;
  Prog *pPVar2;
  SearchThread *pSVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  char *this_00;
  int j;
  long lVar4;
  int iVar5;
  SearchThread *t;
  StringPiece local_218;
  string no_match;
  string match;
  StringPiece local_1c8;
  vector<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_> threads;
  
  StringPrintf_abi_cxx11_((string *)&threads,"0[01]{%d}$",0x12);
  no_match._M_dataplus._M_p =
       (pointer)threads.
                super__Vector_base<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  no_match._M_string_length._0_4_ =
       (int)threads.super__Vector_base<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  this_00 = (char *)0x794;
  this = Regexp::Parse((StringPiece *)&no_match,LikePerl,(RegexpStatus *)0x0);
  std::__cxx11::string::~string((string *)&threads);
  iVar1 = extraout_EDX;
  if (this == (Regexp *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&threads,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
               ,0x110);
    this_00 = "Check failed: re";
    std::operator<<((ostream *)
                    &threads.
                     super__Vector_base<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,"Check failed: re");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&threads);
    iVar1 = extraout_EDX_00;
  }
  DeBruijnString_abi_cxx11_(&no_match,(re2 *)this_00,iVar1);
  std::operator+(&match,&no_match,"0");
  FLAGS_re2_dfa_bail_when_slow = 0;
  pPVar2 = Regexp::CompileToProg(this,0x40000);
  if (pPVar2 == (Prog *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&threads,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
               ,0x118);
    std::operator<<((ostream *)
                    &threads.
                     super__Vector_base<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,"Check failed: prog");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&threads);
  }
  pSVar3 = (SearchThread *)operator_new(0x40);
  threads.super__Vector_base<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)match._M_dataplus._M_p;
  threads.super__Vector_base<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(threads.
                         super__Vector_base<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                         (int)match._M_string_length);
  local_218.ptr_ = no_match._M_dataplus._M_p;
  local_218.length_ = (int)no_match._M_string_length;
  SearchThread::SearchThread(pSVar3,pPVar2,(StringPiece *)&threads,&local_218);
  Thread::SetJoinable((Thread *)pSVar3,true);
  Thread::Start((Thread *)pSVar3);
  Thread::Join((Thread *)pSVar3);
  (*(pSVar3->super_Thread)._vptr_Thread[1])(pSVar3);
  if (pPVar2 != (Prog *)0x0) {
    Prog::~Prog(pPVar2);
  }
  operator_delete(pPVar2);
  for (iVar1 = 0; iVar1 < FLAGS_repeat; iVar1 = iVar1 + 1) {
    pPVar2 = Regexp::CompileToProg(this,0x40000);
    if (pPVar2 == (Prog *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&threads,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
                 ,0x126);
      std::operator<<((ostream *)
                      &threads.
                       super__Vector_base<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,"Check failed: prog");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&threads);
    }
    threads.super__Vector_base<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    threads.super__Vector_base<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    threads.super__Vector_base<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (iVar5 = 0; iVar5 < FLAGS_threads; iVar5 = iVar5 + 1) {
      pSVar3 = (SearchThread *)operator_new(0x40);
      local_218.ptr_ = match._M_dataplus._M_p;
      local_218.length_ = (int)match._M_string_length;
      local_1c8.ptr_ = no_match._M_dataplus._M_p;
      local_1c8.length_ = (int)no_match._M_string_length;
      SearchThread::SearchThread(pSVar3,pPVar2,&local_218,&local_1c8);
      t = pSVar3;
      Thread::SetJoinable((Thread *)pSVar3,true);
      std::vector<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>::push_back(&threads,&t)
      ;
    }
    for (lVar4 = 0; lVar4 < FLAGS_threads; lVar4 = lVar4 + 1) {
      Thread::Start(&threads.
                     super__Vector_base<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar4]->super_Thread);
    }
    for (lVar4 = 0; lVar4 < FLAGS_threads; lVar4 = lVar4 + 1) {
      Thread::Join(&threads.
                    super__Vector_base<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar4]->super_Thread);
      if (threads.super__Vector_base<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar4] != (SearchThread *)0x0) {
        (*(threads.super__Vector_base<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>.
           _M_impl.super__Vector_impl_data._M_start[lVar4]->super_Thread)._vptr_Thread[1])();
      }
    }
    if (pPVar2 != (Prog *)0x0) {
      Prog::~Prog(pPVar2);
    }
    operator_delete(pPVar2);
    std::_Vector_base<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_>::~_Vector_base
              ((_Vector_base<re2::SearchThread_*,_std::allocator<re2::SearchThread_*>_> *)&threads);
  }
  Regexp::Decref(this);
  std::__cxx11::string::~string((string *)&match);
  std::__cxx11::string::~string((string *)&no_match);
  return;
}

Assistant:

TEST(Multithreaded, SearchDFA) {
  // Same as single-threaded test above.
  const int n = 18;
  Regexp* re = Regexp::Parse(StringPrintf("0[01]{%d}$", n),
                             Regexp::LikePerl, NULL);
  CHECK(re);
  string no_match = DeBruijnString(n);
  string match = no_match + "0";
  FLAGS_re2_dfa_bail_when_slow = false;

  // Check that single-threaded code works.
  {
    Prog* prog = re->CompileToProg(1<<n);
    CHECK(prog);
    SearchThread* t = new SearchThread(prog, match, no_match);
    t->SetJoinable(true);
    t->Start();
    t->Join();
    delete t;
    delete prog;
  }

  // Run the search simultaneously in a bunch of threads.
  // Reuse same flags for Multithreaded.BuildDFA above.
  for (int i = 0; i < FLAGS_repeat; i++) {
    //LOG(INFO) << "Search " << i;
    Prog* prog = re->CompileToProg(1<<n);
    CHECK(prog);

    vector<SearchThread*> threads;
    for (int j = 0; j < FLAGS_threads; j++) {
      SearchThread *t = new SearchThread(prog, match, no_match);
      t->SetJoinable(true);
      threads.push_back(t);
    }
    for (int j = 0; j < FLAGS_threads; j++)
      threads[j]->Start();
    for (int j = 0; j < FLAGS_threads; j++) {
      threads[j]->Join();
      delete threads[j];
    }
    delete prog;
  }
  re->Decref();
}